

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  HeapType type_00;
  Tuple *tuple;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  Type local_28;
  Type type_local;
  
  local_28.id = type.id;
  if (type.id < 7) {
    switch(type.id & 0xffffffff) {
    case 0:
      poVar4 = this->os;
      pcVar3 = "none";
      goto LAB_009c7f13;
    case 1:
      poVar4 = this->os;
      pcVar3 = "unreachable";
      lVar2 = 0xb;
      goto LAB_009c7f18;
    case 2:
      poVar4 = this->os;
      pcVar3 = "i32";
      break;
    case 3:
      poVar4 = this->os;
      pcVar3 = "i64";
      break;
    case 4:
      poVar4 = this->os;
      pcVar3 = "f32";
      break;
    case 5:
      poVar4 = this->os;
      pcVar3 = "f64";
      break;
    case 6:
      poVar4 = this->os;
      pcVar3 = "v128";
LAB_009c7f13:
      lVar2 = 4;
      goto LAB_009c7f18;
    default:
      if (6 < type.id) goto LAB_009c7dc1;
      goto LAB_009c7dda;
    }
    lVar2 = 3;
LAB_009c7f18:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
    return poVar4;
  }
LAB_009c7dc1:
  if (*(char *)type.id == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(; temp ;) ",0xb);
  }
LAB_009c7dda:
  if (local_28.id < 7) {
LAB_009c8008:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x769);
  }
  if (*(int *)(local_28.id + 4) == 0) {
    tuple = wasm::Type::getTuple(&local_28);
    print(this,tuple);
    goto LAB_009c7ea2;
  }
  if ((local_28.id < 7) || (*(int *)(local_28.id + 4) != 1)) goto LAB_009c8008;
  type_00 = wasm::Type::getHeapType(&local_28);
  if ((((0xd < type_00.id) || (local_28.id < 7)) || (*(int *)(local_28.id + 4) != 1)) ||
     (*(int *)(local_28.id + 0x10) == 0)) {
switchD_009c7ed6_default:
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(ref ",5);
    if (((6 < local_28.id) && (*(int *)(local_28.id + 4) == 1)) &&
       (*(int *)(local_28.id + 0x10) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"null ",5);
    }
    printHeapTypeName(this,type_00);
    type_local.id._7_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>
              (this->os,(char *)((long)&type_local.id + 7),1);
    bVar1 = true;
    goto LAB_009c7e85;
  }
  switch(type_00.id & 0xffffffff) {
  case 0:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "externref";
    goto LAB_009c7fb5;
  case 1:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "funcref";
    goto LAB_009c7fa4;
  case 2:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "anyref";
    goto LAB_009c7f76;
  case 3:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "eqref";
    lVar2 = 5;
    break;
  case 4:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "i31ref";
LAB_009c7f76:
    lVar2 = 6;
    break;
  case 5:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "structref";
    goto LAB_009c7fb5;
  case 6:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "arrayref";
    lVar2 = 8;
    break;
  case 7:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "stringref";
LAB_009c7fb5:
    lVar2 = 9;
    break;
  case 8:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "stringview_wtf8";
    goto LAB_009c7ff4;
  case 9:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "stringview_wtf16";
    lVar2 = 0x10;
    break;
  case 10:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "stringview_iter";
LAB_009c7ff4:
    lVar2 = 0xf;
    break;
  case 0xb:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "nullref";
LAB_009c7fa4:
    lVar2 = 7;
    break;
  case 0xc:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "nullexternref";
    lVar2 = 0xd;
    break;
  case 0xd:
    type_00.id = (uintptr_t)this->os;
    pcVar3 = "nullfuncref";
    lVar2 = 0xb;
    break;
  default:
    goto switchD_009c7ed6_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)type_00.id,pcVar3,lVar2);
  bVar1 = false;
LAB_009c7e85:
  if (bVar1) {
LAB_009c7ea2:
    type_00.id = (uintptr_t)this->os;
  }
  return (ostream *)type_00.id;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      // Print shorthands for certain basic heap types.
      if (type.isNullable()) {
        switch (heapType.getBasic()) {
          case HeapType::ext:
            return os << "externref";
          case HeapType::func:
            return os << "funcref";
          case HeapType::any:
            return os << "anyref";
          case HeapType::eq:
            return os << "eqref";
          case HeapType::i31:
            return os << "i31ref";
          case HeapType::struct_:
            return os << "structref";
          case HeapType::array:
            return os << "arrayref";
          case HeapType::string:
            return os << "stringref";
          case HeapType::stringview_wtf8:
            return os << "stringview_wtf8";
          case HeapType::stringview_wtf16:
            return os << "stringview_wtf16";
          case HeapType::stringview_iter:
            return os << "stringview_iter";
          case HeapType::none:
            return os << "nullref";
          case HeapType::noext:
            return os << "nullexternref";
          case HeapType::nofunc:
            return os << "nullfuncref";
        }
      }
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    printHeapTypeName(heapType);
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}